

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_recon.c
# Opt level: O1

REF_STATUS
ref_recon_signed_hessian
          (REF_GRID ref_grid,REF_DBL *scalar,REF_DBL *hessian,REF_RECON_RECONSTRUCTION recon)

{
  int *piVar1;
  size_t __size;
  REF_NODE pRVar2;
  REF_GLOB *pRVar3;
  REF_CELL pRVar4;
  REF_ADJ pRVar5;
  REF_INT *pRVar6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  REF_DBL *grad;
  undefined4 extraout_var;
  REF_NODE grad_00;
  long *plVar10;
  REF_BOOL *replace;
  void *__ptr;
  ulong uVar11;
  ulong uVar12;
  undefined8 uVar13;
  void *pvVar14;
  REF_NODE ref_node;
  REF_BOOL *pRVar15;
  REF_DBL *pRVar16;
  long lVar17;
  long lVar18;
  char *pcVar19;
  long lVar20;
  long lVar21;
  REF_DBL *pRVar22;
  REF_EDGE ref_edge;
  REF_NODE local_68;
  REF_DBL *local_60;
  REF_DBL *local_50;
  REF_DBL *local_40;
  REF_EDGE local_38;
  
  if (recon == REF_RECON_KEXACT) {
    uVar9 = ref_recon_kexact_gradient_hessian(ref_grid,scalar,(REF_DBL *)0x0,hessian);
    if (uVar9 == 0) {
      return 0;
    }
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x599,
           "ref_recon_signed_hessian",(ulong)uVar9,"k-exact");
    return uVar9;
  }
  if (recon != REF_RECON_L2PROJECTION) {
    pcVar19 = "reconstruction not available";
    uVar13 = 0x59d;
LAB_001ed4d7:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",uVar13,
           "ref_recon_signed_hessian",pcVar19);
    return 1;
  }
  pRVar2 = ref_grid->node;
  uVar9 = pRVar2->max;
  pRVar22 = (REF_DBL *)(ulong)uVar9;
  if ((int)uVar9 < 0) {
    bVar7 = false;
    iVar8 = printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                   ,0x17e);
    grad = (REF_DBL *)CONCAT44(extraout_var,iVar8);
    pRVar22 = (REF_DBL *)0x1;
  }
  else {
    grad = (REF_DBL *)malloc((long)pRVar22 * 0x18);
    if (grad == (REF_DBL *)0x0) {
      bVar7 = false;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x17e
            );
      grad = (REF_DBL *)0x0;
      pRVar22 = (REF_DBL *)0x2;
    }
    else {
      bVar7 = true;
      if (pRVar22 != (REF_DBL *)0x0) {
        uVar11 = 1;
        if (1 < (int)(uVar9 * 3)) {
          uVar11 = (ulong)(uVar9 * 3);
        }
        memset(grad,0,uVar11 << 3);
        pRVar22 = grad;
      }
    }
  }
  if (bVar7) {
    iVar8 = pRVar2->max;
    if ((long)iVar8 < 0) {
      bVar7 = false;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x17f
            );
      pRVar22 = (REF_DBL *)0x1;
    }
    else {
      __size = (long)iVar8 * 8;
      local_60 = (REF_DBL *)malloc(__size);
      if (local_60 == (REF_DBL *)0x0) {
        local_60 = (REF_DBL *)0x0;
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
               0x17f);
        pRVar22 = (REF_DBL *)0x2;
        bVar7 = false;
      }
      else {
        bVar7 = true;
        if (iVar8 != 0) {
          memset(local_60,0,__size);
        }
      }
    }
    local_68 = pRVar2;
    if (bVar7) {
      uVar11 = (ulong)(uint)pRVar2->max;
      if (pRVar2->max < 0) {
        bVar7 = false;
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
               0x180);
        pRVar22 = (REF_DBL *)0x1;
      }
      else {
        local_50 = (REF_DBL *)malloc(uVar11 * 0x18);
        if (local_50 == (REF_DBL *)0x0) {
          local_50 = (REF_DBL *)0x0;
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
                 0x180);
          pRVar22 = (REF_DBL *)0x2;
          bVar7 = false;
        }
        else {
          bVar7 = true;
          if (uVar11 != 0) {
            uVar12 = 1;
            if (1 < (int)(uVar11 * 3)) {
              uVar12 = uVar11 * 3 & 0xffffffff;
            }
            memset(local_50,0,uVar12 << 3);
          }
        }
      }
      if (bVar7) {
        uVar11 = (ulong)(uint)pRVar2->max;
        if (pRVar2->max < 0) {
          bVar7 = false;
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
                 0x181);
          pRVar22 = (REF_DBL *)0x1;
        }
        else {
          local_40 = (REF_DBL *)malloc(uVar11 * 0x18);
          if (local_40 == (REF_DBL *)0x0) {
            local_40 = (REF_DBL *)0x0;
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                   ,0x181);
            pRVar22 = (REF_DBL *)0x2;
            bVar7 = false;
          }
          else {
            bVar7 = true;
            if (uVar11 != 0) {
              uVar12 = 1;
              if (1 < (int)(uVar11 * 3)) {
                uVar12 = uVar11 * 3 & 0xffffffff;
              }
              memset(local_40,0,uVar12 << 3);
            }
          }
        }
        if (bVar7) {
          uVar11 = (ulong)(uint)pRVar2->max;
          if (pRVar2->max < 0) {
            bVar7 = false;
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                   ,0x182);
            pRVar22 = (REF_DBL *)0x1;
            grad_00 = pRVar2;
          }
          else {
            grad_00 = (REF_NODE)malloc(uVar11 * 0x18);
            if (grad_00 == (REF_NODE)0x0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                     ,0x182);
              pRVar22 = (REF_DBL *)0x2;
              bVar7 = false;
              grad_00 = (REF_NODE)0x0;
            }
            else {
              bVar7 = true;
              if (uVar11 != 0) {
                uVar12 = 1;
                if (1 < (int)(uVar11 * 3)) {
                  uVar12 = uVar11 * 3 & 0xffffffff;
                }
                memset(grad_00,0,uVar12 << 3);
              }
            }
          }
          if (bVar7) {
            uVar9 = ref_recon_l2_projection_grad(ref_grid,scalar,grad);
            if ((uVar9 & 0xfffffffb) != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                     ,0x185);
              pRVar22 = (REF_DBL *)(ulong)uVar9;
            }
            if ((uVar9 & 0xfffffffb) == 0) {
              iVar8 = pRVar2->max;
              if (0 < (long)iVar8) {
                pRVar3 = pRVar2->global;
                lVar17 = 0;
                pRVar16 = grad;
                do {
                  if (-1 < pRVar3[lVar17]) {
                    local_60[lVar17] = *pRVar16;
                  }
                  lVar17 = lVar17 + 1;
                  pRVar16 = pRVar16 + 3;
                } while (iVar8 != lVar17);
              }
              uVar9 = ref_recon_l2_projection_grad(ref_grid,local_60,local_50);
              if ((uVar9 & 0xfffffffb) != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                       ,0x18a);
                pRVar22 = (REF_DBL *)(ulong)uVar9;
              }
              if ((uVar9 & 0xfffffffb) == 0) {
                iVar8 = pRVar2->max;
                if (0 < (long)iVar8) {
                  pRVar3 = pRVar2->global;
                  pRVar16 = grad + 1;
                  lVar17 = 0;
                  do {
                    if (-1 < pRVar3[lVar17]) {
                      local_60[lVar17] = *pRVar16;
                    }
                    lVar17 = lVar17 + 1;
                    pRVar16 = pRVar16 + 3;
                  } while (iVar8 != lVar17);
                }
                uVar9 = ref_recon_l2_projection_grad(ref_grid,local_60,local_40);
                if ((uVar9 & 0xfffffffb) != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                         ,399);
                  pRVar22 = (REF_DBL *)(ulong)uVar9;
                }
                if ((uVar9 & 0xfffffffb) == 0) {
                  iVar8 = pRVar2->max;
                  if (0 < (long)iVar8) {
                    pRVar3 = pRVar2->global;
                    pRVar16 = grad + 2;
                    lVar17 = 0;
                    do {
                      if (-1 < pRVar3[lVar17]) {
                        local_60[lVar17] = *pRVar16;
                      }
                      lVar17 = lVar17 + 1;
                      pRVar16 = pRVar16 + 3;
                    } while (iVar8 != lVar17);
                  }
                  uVar9 = ref_recon_l2_projection_grad(ref_grid,local_60,(REF_DBL *)grad_00);
                  if ((uVar9 & 0xfffffffb) != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                           ,0x194);
                    pRVar22 = (REF_DBL *)(ulong)uVar9;
                  }
                  if ((uVar9 & 0xfffffffb) == 0) {
                    iVar8 = pRVar2->max;
                    if (0 < (long)iVar8) {
                      plVar10 = pRVar2->global;
                      lVar17 = 0;
                      do {
                        if (-1 < *plVar10) {
                          *(undefined8 *)((long)hessian + lVar17 * 2) =
                               *(undefined8 *)((long)local_50 + lVar17);
                          *(double *)((long)hessian + lVar17 * 2 + 8) =
                               (*(double *)((long)local_50 + lVar17 + 8) +
                               *(double *)((long)local_40 + lVar17)) * 0.5;
                          *(double *)((long)hessian + lVar17 * 2 + 0x10) =
                               (*(double *)((long)local_50 + lVar17 + 0x10) +
                               *(double *)((long)&grad_00->n + lVar17)) * 0.5;
                          *(undefined8 *)((long)hessian + lVar17 * 2 + 0x18) =
                               *(undefined8 *)((long)local_40 + lVar17 + 8);
                          *(double *)((long)hessian + lVar17 * 2 + 0x20) =
                               (*(double *)((long)local_40 + lVar17 + 0x10) +
                               *(double *)((long)&grad_00->blank + lVar17)) * 0.5;
                          *(undefined8 *)((long)hessian + lVar17 * 2 + 0x28) =
                               *(undefined8 *)((long)&grad_00->global + lVar17);
                        }
                        lVar17 = lVar17 + 0x18;
                        plVar10 = plVar10 + 1;
                      } while ((long)iVar8 * 0x18 != lVar17);
                    }
                    if (grad_00 != (REF_NODE)0x0) {
                      free(grad_00);
                    }
                    if (local_40 != (REF_DBL *)0x0) {
                      free(local_40);
                    }
                    if (local_50 != (REF_DBL *)0x0) {
                      free(local_50);
                    }
                    if (local_60 != (REF_DBL *)0x0) {
                      free(local_60);
                    }
                    pRVar22 = (REF_DBL *)0x0;
                    if (grad != (REF_DBL *)0x0) {
                      free(grad);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  if ((int)pRVar22 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x58b,
           "ref_recon_signed_hessian",(ulong)pRVar22 & 0xffffffff,"l2");
    return (int)pRVar22;
  }
  pRVar2 = ref_grid->node;
  uVar9 = pRVar2->max;
  if ((int)uVar9 < 0) {
    pcVar19 = "malloc replace of REF_BOOL negative";
    uVar13 = 0x58c;
    goto LAB_001ed4d7;
  }
  replace = (REF_BOOL *)malloc((ulong)uVar9 * 0x18);
  if (replace == (REF_BOOL *)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x58c,
           "ref_recon_signed_hessian","malloc replace of REF_BOOL NULL");
    return 2;
  }
  if (ref_grid->twod == 0) {
    ref_recon_mask_tri(ref_grid,replace,6);
  }
  else if ((ulong)uVar9 != 0) {
    pRVar4 = ref_grid->cell[0];
    pRVar3 = pRVar2->global;
    lVar17 = 0;
    pRVar15 = replace;
    do {
      if (-1 < pRVar3[lVar17]) {
        pRVar5 = pRVar4->ref_adj;
        lVar18 = 0;
        do {
          uVar9 = 0;
          if (lVar17 < pRVar5->nnode) {
            uVar9 = (uint)(pRVar5->first[lVar17] != -1);
          }
          pRVar15[lVar18] = uVar9;
          lVar18 = lVar18 + 1;
        } while (lVar18 != 6);
      }
      lVar17 = lVar17 + 1;
      pRVar15 = pRVar15 + 6;
    } while (lVar17 < pRVar2->max);
  }
  uVar9 = pRVar2->max;
  if ((int)uVar9 < 0) {
    local_68 = (REF_NODE)0x1;
    pcVar19 = "malloc contributions of REF_INT negative";
  }
  else {
    __ptr = malloc((ulong)uVar9 * 0x18);
    if (__ptr != (void *)0x0) {
      if ((ulong)uVar9 != 0) {
        lVar17 = 0;
        do {
          *(undefined4 *)((long)__ptr + lVar17 * 4) = 0;
          lVar17 = lVar17 + 1;
        } while (lVar17 < (long)pRVar2->max * 6);
      }
      bVar7 = true;
      goto LAB_001edd50;
    }
    local_68 = (REF_NODE)0x2;
    pcVar19 = "malloc contributions of REF_INT NULL";
  }
  bVar7 = false;
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x56b,
         "ref_recon_skip_orphan_replace",pcVar19);
  __ptr = (void *)0x0;
LAB_001edd50:
  if (bVar7) {
    uVar9 = ref_edge_create(&local_38,ref_grid);
    if (uVar9 == 0) {
      if (0 < local_38->n) {
        pRVar6 = local_38->e2n;
        lVar17 = 0;
        do {
          lVar20 = (long)pRVar6[lVar17 * 2];
          lVar18 = (long)(pRVar6[lVar17 * 2 + 1] * 6);
          lVar21 = 0;
          do {
            iVar8 = replace[lVar20 * 6 + lVar21];
            if ((iVar8 != 0) && (replace[lVar18 + lVar21] == 0)) {
              piVar1 = (int *)((long)__ptr + lVar21 * 4 + lVar20 * 0x18);
              *piVar1 = *piVar1 + 1;
            }
            if ((iVar8 == 0) && (replace[lVar18 + lVar21] != 0)) {
              piVar1 = (int *)((long)__ptr + lVar21 * 4 + lVar18 * 4);
              *piVar1 = *piVar1 + 1;
            }
            lVar21 = lVar21 + 1;
          } while (lVar21 != 6);
          lVar17 = lVar17 + 1;
        } while (lVar17 < local_38->n);
      }
      uVar9 = ref_edge_free(local_38);
      if (uVar9 == 0) {
        if (0 < pRVar2->max) {
          pRVar3 = pRVar2->global;
          lVar17 = 0;
          pvVar14 = __ptr;
          pRVar15 = replace;
          do {
            if (-1 < pRVar3[lVar17]) {
              lVar18 = 0;
              do {
                if (*(int *)((long)pvVar14 + lVar18 * 4) == 0) {
                  pRVar15[lVar18] = 0;
                }
                lVar18 = lVar18 + 1;
              } while (lVar18 != 6);
            }
            lVar17 = lVar17 + 1;
            pRVar15 = pRVar15 + 6;
            pvVar14 = (void *)((long)pvVar14 + 0x18);
          } while (lVar17 < pRVar2->max);
        }
        local_68 = (REF_NODE)0x0;
        if (__ptr != (void *)0x0) {
          free(__ptr);
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
               0x579,"ref_recon_skip_orphan_replace",(ulong)uVar9,"free edge");
        local_68 = (REF_NODE)(ulong)uVar9;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x56c
             ,"ref_recon_skip_orphan_replace",(ulong)uVar9,"edges");
      local_68 = (REF_NODE)(ulong)uVar9;
    }
  }
  if ((uint)local_68 == 0) {
    local_68._0_4_ = ref_recon_extrapolate_zeroth(ref_grid,hessian,replace,6);
    if ((uint)local_68 == 0) {
      free(replace);
      local_68._0_4_ = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x594
             ,"ref_recon_signed_hessian",(ulong)(uint)local_68,"bound extrap");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x592,
           "ref_recon_signed_hessian",(ulong)local_68 & 0xffffffff,"skip orphans");
  }
  return (uint)local_68;
}

Assistant:

REF_FCN REF_STATUS ref_recon_signed_hessian(REF_GRID ref_grid, REF_DBL *scalar,
                                            REF_DBL *hessian,
                                            REF_RECON_RECONSTRUCTION recon) {
  REF_BOOL *replace;

  switch (recon) {
    case REF_RECON_L2PROJECTION:
      RSS(ref_recon_l2_projection_hessian(ref_grid, scalar, hessian), "l2");
      ref_malloc(replace, 6 * ref_node_max(ref_grid_node(ref_grid)), REF_BOOL);
      if (ref_grid_twod(ref_grid)) {
        RSS(ref_recon_mask_edg(ref_grid, replace, 6), "mask edg");
      } else {
        RSS(ref_recon_mask_tri(ref_grid, replace, 6), "mask tri");
      }
      RSS(ref_recon_skip_orphan_replace(ref_grid, replace, 6), "skip orphans");
      RSS(ref_recon_extrapolate_zeroth(ref_grid, hessian, replace, 6),
          "bound extrap");
      ref_free(replace);
      break;
    case REF_RECON_KEXACT:
      RSS(ref_recon_kexact_gradient_hessian(ref_grid, scalar, NULL, hessian),
          "k-exact");
      break;
    case REF_RECON_LAST:
    default:
      THROW("reconstruction not available");
  }

  return REF_SUCCESS;
}